

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O2

ssize_t fb_fls(fb_group_t *fb,size_t nbits,size_t max_bit)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = nbits >> 6;
  uVar3 = (2L << ((byte)nbits & 0x3f)) - 1U & fb[uVar2];
  lVar1 = -(nbits & 0xffffffffffffffc0);
  while( true ) {
    if (uVar3 != 0) {
      uVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      return (uVar2 ^ 0x3f) - lVar1 ^ 0x3f;
    }
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) break;
    uVar3 = fb[uVar2];
    lVar1 = lVar1 + 0x40;
  }
  return -1;
}

Assistant:

static inline ssize_t
fb_fls(fb_group_t *fb, size_t nbits, size_t max_bit) {
	return fb_find_impl(fb, nbits, max_bit, /* val */ true,
	    /* forward */ false);
}